

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

uint64_t ar_atol8(char *p,uint char_cnt)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  uint local_34;
  uint base;
  uint digit;
  uint64_t last_digit_limit;
  uint64_t limit;
  uint64_t l;
  char *pcStack_10;
  uint char_cnt_local;
  char *p_local;
  
  uVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / ZEXT416(8),0);
  l._4_4_ = char_cnt;
  pcStack_10 = p;
  while( true ) {
    if ((*pcStack_10 == ' ') || (bVar3 = false, *pcStack_10 == '\t')) {
      bVar3 = l._4_4_ != 0;
      l._4_4_ = l._4_4_ - 1;
    }
    if (!bVar3) break;
    pcStack_10 = pcStack_10 + 1;
  }
  limit = 0;
  cVar1 = *pcStack_10;
  while( true ) {
    local_34 = (int)cVar1 - 0x30;
    bVar3 = false;
    if (('/' < *pcStack_10) && (bVar3 = false, local_34 < 8)) {
      bVar3 = l._4_4_ != 0;
      l._4_4_ = l._4_4_ - 1;
    }
    if (!bVar3) break;
    if ((uVar2 < limit) ||
       ((limit == uVar2 &&
        (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) % ZEXT416(8),0) < (ulong)local_34
        )))) {
      return 0xffffffffffffffff;
    }
    limit = limit * 8 + (ulong)local_34;
    cVar1 = pcStack_10[1];
    pcStack_10 = pcStack_10 + 1;
  }
  return limit;
}

Assistant:

static uint64_t
ar_atol8(const char *p, unsigned char_cnt)
{
	uint64_t l, limit, last_digit_limit;
	unsigned int digit, base;

	base = 8;
	limit = UINT64_MAX / base;
	last_digit_limit = UINT64_MAX % base;

	while ((*p == ' ' || *p == '\t') && char_cnt-- > 0)
		p++;

	l = 0;
	digit = *p - '0';
	while (*p >= '0' && digit < base  && char_cnt-- > 0) {
		if (l>limit || (l == limit && digit > last_digit_limit)) {
			l = UINT64_MAX; /* Truncate on overflow. */
			break;
		}
		l = (l * base) + digit;
		digit = *++p - '0';
	}
	return (l);
}